

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLatticePentRod.cpp
# Opt level: O0

bool __thiscall OpenMD::shapedLatticePentRod::isInterior(shapedLatticePentRod *this,Vector3d *point)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Vector<double,_3U> *in_RSI;
  int __x;
  long in_RDI;
  double dVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  bool isIT;
  RealType right_newx;
  RealType left_newx;
  RealType new_y;
  RealType new_x;
  RealType z;
  RealType y;
  RealType x;
  bool local_49;
  
  local_49 = false;
  pdVar3 = Vector<double,_3U>::operator[](in_RSI,0);
  dVar5 = *pdVar3;
  pdVar3 = Vector<double,_3U>::operator[](in_RSI,1);
  dVar1 = *pdVar3;
  pdVar3 = Vector<double,_3U>::operator[](in_RSI,2);
  __x = (int)in_RSI;
  dVar2 = *pdVar3;
  dVar4 = sqrt(2.0);
  dVar5 = (dVar4 / 2.0) * (dVar5 - dVar1);
  sqrt(2.0);
  if ((((dVar2 < 0.0) && (*(double *)(in_RDI + 0xb8) * -0.816496581 + -1.44 <= dVar2)) &&
      (std::abs(__x),
      extraout_XMM0_Qa <=
      *(double *)(in_RDI + 0xb8) * 0.5773502692 +
      (dVar2 / 2.04) * 1.44 + *(double *)(in_RDI + 0xc0) * 0.5)) &&
     (((dVar2 - 1.44) * 0.7071067808917132 <= dVar5 &&
      (dVar5 <= (dVar2 + 1.44) * -0.7071067808917132)))) {
    local_49 = true;
  }
  return local_49;
}

Assistant:

bool shapedLatticePentRod::isInterior(Vector3d point) {
    RealType x, y, z, new_x, new_y, left_newx, right_newx;
    // int z_int;

    bool isIT = false;

    x = point[0];
    y = point[1];
    z = point[2];

    // z_int = int(z/2.04);

    // Rotate by 45 degrees around z-axis so length of rod lies along y axis
    new_x = (sqrt(2.0) / 2) * (x - y);
    new_y = (sqrt(2.0) / 2) * (x + y);

    left_newx  = (z - 1.44) * (0.577350269 / 0.816496581);
    right_newx = (z + 1.44) * (-0.577350269 / 0.816496581);

    // Make center spine of nanorod down new_y axis
    // This is now done directly in nanorod_pentBuilder.cpp
    /*if ( (new_x == 0) && (z == 0) ) {

    if ( abs(new_y) <= 0.5*rodLength_ + 0.5773502692*rodRadius_ ) {

      isIT = true;

    }
    }*/

    // Make one wedge
    if ((z < 0) && (z >= -0.816496581 * rodRadius_ - 1.44)) {
      if (abs(new_y) <=
          1.44 * (z / 2.04) + 0.5 * rodLength_ + 0.5773502692 * rodRadius_) {
        if ((new_x >= left_newx) && (new_x <= right_newx)) { isIT = true; }
      }
    }
    return isIT;
  }